

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# castchannel.h
# Opt level: O0

void __thiscall CastMessage::reset(CastMessage *this)

{
  CastMessage *this_local;
  
  this->_protocol_version = 0;
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  this->_payload_type = 0;
  std::__cxx11::string::clear();
  std::__cxx11::
  basic_string<unsigned_char,_std::char_traits<unsigned_char>,_std::allocator<unsigned_char>_>::
  clear(&this->_payload_binary);
  return;
}

Assistant:

void reset() override {
        _protocol_version = CASTV2_1_0;
        _source_id.clear();
        _destination_id.clear();
        _namespace.clear();
        _payload_type = STRING;
        _payload_utf8.clear();
        _payload_binary.clear();
    }